

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromDarSeqSweep(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  Nm_Man_t *pNVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *p;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint nDigits;
  Abc_Ntk_t *pAVar12;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1dc,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pNtkOld->nBarBufs == 0) {
    pNtk = Abc_NtkStartFromNoLatches(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
    iVar10 = pMan->nBarBufs;
    pNtk->nConstrs = pMan->nConstrs;
    pNtk->nBarBufs = iVar10;
    iVar10 = pNtk->vCis->nSize;
    iVar2 = pMan->nRegs;
    iVar9 = pMan->nObjs[2] - iVar2;
    if (iVar10 < iVar9) {
      for (iVar10 = pMan->nObjs[2] - (iVar10 + iVar2); 0 < iVar10; iVar10 = iVar10 + -1) {
        pAVar3 = Abc_NtkCreatePi(pNtk);
        pcVar4 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
      }
      Abc_NtkOrderCisCos(pNtk);
      iVar10 = pNtk->vCis->nSize;
      iVar2 = pMan->nRegs;
      iVar9 = pMan->nObjs[2] - iVar2;
    }
    if (iVar10 == iVar9) {
      if (pNtk->vCos->nSize != pMan->nObjs[3] - iVar2) {
        __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                      ,0x1ee,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
      }
      pAVar3 = Abc_AigConst1(pNtk);
      (pMan->pConst1->field_5).pData = pAVar3;
      for (iVar10 = 0; iVar2 = pMan->nRegs, iVar10 < pMan->nObjs[2] - iVar2; iVar10 = iVar10 + 1) {
        pvVar5 = Vec_PtrEntry(pMan->vCis,iVar10);
        pAVar3 = Abc_NtkCi(pNtk,iVar10);
        *(Abc_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
      }
      for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
        pAVar6 = Aig_ManLi(pMan,iVar10);
        pAVar7 = Aig_ManLo(pMan,iVar10);
        pAVar3 = Abc_NtkCreateLatch(pNtk);
        pAVar8 = Abc_NtkCreateBi(pNtk);
        (pAVar6->field_5).pData = pAVar8;
        pAVar8 = Abc_NtkCreateBo(pNtk);
        (pAVar7->field_5).pData = pAVar8;
        Abc_ObjAddFanin(pAVar3,(Abc_Obj_t *)(pAVar6->field_5).pData);
        Abc_ObjAddFanin((Abc_Obj_t *)(pAVar7->field_5).pData,pAVar3);
        Abc_LatchSetInit0(pAVar3);
        iVar2 = pMan->nRegs;
      }
      p = Aig_ManDfs(pMan,1);
      for (iVar10 = 0; iVar10 < p->nSize; iVar10 = iVar10 + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar10);
        if ((*(uint *)&pAVar6->field_0x18 & 7) == 4) {
          pAVar3 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar6);
        }
        else {
          pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar3 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar6);
          pAVar8 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar6);
          pAVar3 = Abc_AigAnd(pMan_00,pAVar3,pAVar8);
        }
        (pAVar6->field_5).pData = pAVar3;
      }
      Vec_PtrFree(p);
      for (iVar10 = 0; iVar10 < pMan->vCos->nSize; iVar10 = iVar10 + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar10);
        pNVar1 = pNtk->pManName;
        pAVar3 = Abc_NtkCo(pNtk,iVar10);
        pcVar4 = Abc_ObjName(pAVar3);
        iVar2 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar4,2,5);
        if (iVar2 < 0) {
          pAVar3 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar6);
        }
        else {
          pAVar3 = Abc_NtkObj(pNtk,iVar2);
        }
        pAVar8 = Abc_NtkCo(pNtk,iVar10);
        Abc_ObjAddFanin(pAVar8,pAVar3);
      }
      if (pMan->vFlopNums == (Vec_Int_t *)0x0) {
        Abc_NtkAddDummyBoxNames(pNtk);
      }
      else {
        if (pNtkOld->vBoxes->nSize != pNtkOld->nObjCounts[8]) {
          __assert_fail("Abc_NtkBoxNum(pNtkOld) == Abc_NtkLatchNum(pNtkOld)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                        ,0x22a,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
        }
        nDigits = pNtk->nObjCounts[8];
        if (1 < nDigits) {
          uVar11 = nDigits - 1;
          nDigits = 0;
          for (; uVar11 != 0; uVar11 = uVar11 / 10) {
            nDigits = nDigits + 1;
          }
        }
        for (iVar10 = 0; iVar10 < pNtk->vBoxes->nSize; iVar10 = iVar10 + 1) {
          pAVar3 = Abc_NtkBox(pNtk,iVar10);
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
            iVar2 = Vec_IntEntry(pMan->vFlopNums,iVar10);
            pAVar8 = Abc_NtkBox(pNtkOld,iVar2);
            pNVar1 = pNtk->pManName;
            pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray]);
            iVar2 = Nm_ManFindIdByName(pNVar1,pcVar4,3);
            if (iVar2 < 0) {
              pcVar4 = Abc_ObjName(pAVar8);
              Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
              pObj = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
              pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray]);
              Abc_ObjAssignName(pObj,pcVar4,(char *)0x0);
              pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
              pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray]);
            }
            else {
              pcVar4 = Abc_ObjNameDummy("l",iVar10,nDigits);
              Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
              pAVar8 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
              pcVar4 = Abc_ObjNameDummy("li",iVar10,nDigits);
              Abc_ObjAssignName(pAVar8,pcVar4,(char *)0x0);
              pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
              pcVar4 = Abc_ObjNameDummy("lo",iVar10,nDigits);
            }
            Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
          }
        }
      }
      pAVar12 = pNtk;
      iVar10 = Abc_NtkCheck(pNtk);
      if (iVar10 == 0) {
        Abc_Print((int)pAVar12,"Abc_NtkFromDar(): Network check has failed.\n");
      }
      return pNtk;
    }
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1ed,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  __assert_fail("pNtkOld->nBarBufs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x1dd,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarSeqSweep( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pLatch;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i, iNodeId, nDigits; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
//    assert( Aig_ManRegNum(pMan) != Abc_NtkLatchNum(pNtkOld) );
    // perform strashing
    pNtkNew = Abc_NtkStartFromNoLatches( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // consider the case of target enlargement
    if ( Abc_NtkCiNum(pNtkNew) < Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) )
    {
        for ( i = Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) - Abc_NtkCiNum(pNtkNew); i > 0; i-- )
        {
            pObjNew = Abc_NtkCreatePi( pNtkNew );
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        }
        Abc_NtkOrderCisCos( pNtkNew );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // transfer the pointers to the basic nodes
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachPiSeq( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
//        if ( pMan->nAsserts && i == Aig_ManCoNum(pMan) - pMan->nAsserts )
//            break;
        iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(Abc_NtkCo(pNtkNew, i)), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( iNodeId >= 0 )
            pObjNew = Abc_NtkObj( pNtkNew, iNodeId );
        else
            pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    if ( pMan->vFlopNums == NULL )
        Abc_NtkAddDummyBoxNames( pNtkNew );
    else
    {
/*
        {
            int i, k, iFlop, Counter = 0;
            FILE * pFile;
            pFile = fopen( "out.txt", "w" );
            fAbc_Print( 1, pFile, "The total of %d registers were removed (out of %d):\n", 
                Abc_NtkLatchNum(pNtkOld)-Vec_IntSize(pMan->vFlopNums), Abc_NtkLatchNum(pNtkOld) );
            for ( i = 0; i < Abc_NtkLatchNum(pNtkOld); i++ )
            {
                Vec_IntForEachEntry( pMan->vFlopNums, iFlop, k )
                {
                    if ( i == iFlop )
                        break;
                }
                if ( k == Vec_IntSize(pMan->vFlopNums) )
                    fAbc_Print( 1, pFile, "%6d (%6d)  :  %s\n", ++Counter, i, Abc_ObjName( Abc_ObjFanout0(Abc_NtkBox(pNtkOld, i)) ) );
            }
            fclose( pFile );
            //Abc_Print( 1, "\n" );
        }
*/
        assert( Abc_NtkBoxNum(pNtkOld) == Abc_NtkLatchNum(pNtkOld) );
        nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtkNew) );
        Abc_NtkForEachLatch( pNtkNew, pObjNew, i )
        {
            pLatch = Abc_NtkBox( pNtkOld, Vec_IntEntry( pMan->vFlopNums, i ) );
            iNodeId = Nm_ManFindIdByName( pNtkNew->pManName, Abc_ObjName(Abc_ObjFanout0(pLatch)), ABC_OBJ_PO );
            if ( iNodeId >= 0 )
            {
                Abc_ObjAssignName( pObjNew, Abc_ObjNameDummy("l", i, nDigits), NULL );
                Abc_ObjAssignName( Abc_ObjFanin0(pObjNew), Abc_ObjNameDummy("li", i, nDigits), NULL );
                Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjNameDummy("lo", i, nDigits), NULL );
//Abc_Print( 1, "happening   %s -> %s\n", Abc_ObjName(Abc_ObjFanin0(pObjNew)), Abc_ObjName(Abc_ObjFanout0(pObjNew)) );
                continue;
            }
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pLatch), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pLatch)), NULL );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pLatch)), NULL );
        }
    }
    // if there are assertions, add them
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );
    return pNtkNew;
}